

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void FT_Select_Metrics(FT_Face face,FT_ULong strike_index)

{
  ushort uVar1;
  FT_Bitmap_Size *pFVar2;
  FT_Size pFVar3;
  FT_Long a_;
  FT_Long FVar4;
  
  pFVar2 = face->available_sizes;
  pFVar3 = face->size;
  FVar4 = pFVar2[strike_index].x_ppem;
  (pFVar3->metrics).x_ppem = (FT_UShort)((int)FVar4 + 0x20U >> 6);
  a_ = pFVar2[strike_index].y_ppem;
  (pFVar3->metrics).y_ppem = (FT_UShort)((int)a_ + 0x20U >> 6);
  if ((face->face_flags & 1) == 0) {
    (pFVar3->metrics).x_scale = 0x10000;
    (pFVar3->metrics).y_scale = 0x10000;
    (pFVar3->metrics).ascender = a_;
    (pFVar3->metrics).descender = 0;
    (pFVar3->metrics).height = (long)pFVar2[strike_index].height << 6;
    (pFVar3->metrics).max_advance = FVar4;
    return;
  }
  uVar1 = face->units_per_EM;
  FVar4 = FT_DivFix(FVar4,(ulong)uVar1);
  (pFVar3->metrics).x_scale = FVar4;
  FVar4 = FT_DivFix(a_,(ulong)uVar1);
  (pFVar3->metrics).y_scale = FVar4;
  ft_recompute_scaled_metrics(face,&pFVar3->metrics);
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Select_Metrics( FT_Face   face,
                     FT_ULong  strike_index )
  {
    FT_Size_Metrics*  metrics;
    FT_Bitmap_Size*   bsize;


    metrics = &face->size->metrics;
    bsize   = face->available_sizes + strike_index;

    metrics->x_ppem = (FT_UShort)( ( bsize->x_ppem + 32 ) >> 6 );
    metrics->y_ppem = (FT_UShort)( ( bsize->y_ppem + 32 ) >> 6 );

    if ( FT_IS_SCALABLE( face ) )
    {
      metrics->x_scale = FT_DivFix( bsize->x_ppem,
                                    face->units_per_EM );
      metrics->y_scale = FT_DivFix( bsize->y_ppem,
                                    face->units_per_EM );

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      metrics->x_scale     = 1L << 16;
      metrics->y_scale     = 1L << 16;
      metrics->ascender    = bsize->y_ppem;
      metrics->descender   = 0;
      metrics->height      = bsize->height << 6;
      metrics->max_advance = bsize->x_ppem;
    }
  }